

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Misc.cpp
# Opt level: O3

uint32_t net_uv::net_tcp_getListenPort(uv_tcp_t *handle)

{
  int iVar1;
  sockaddr *name;
  uint32_t uVar2;
  int32_t client_addr_length;
  int local_24;
  
  name = (sockaddr *)calloc(1,0x38);
  iVar1 = uv_tcp_getsockname(handle,name,&local_24);
  uVar2 = 0;
  if (iVar1 == 0) {
    uVar2 = (uint32_t)(ushort)(*(ushort *)name->sa_data << 8 | *(ushort *)name->sa_data >> 8);
  }
  free(name);
  return uVar2;
}

Assistant:

uint32_t net_tcp_getListenPort(const uv_tcp_t* handle)
{
	int32_t client_addr_length = sizeof(sockaddr_in6) * 2;
	struct sockaddr* client_addr = (struct sockaddr*)fc_malloc(client_addr_length);
	memset(client_addr, 0, client_addr_length);

	int32_t r = uv_tcp_getsockname(handle, client_addr, &client_addr_length);

	uint32_t outPort = 0;

	if (r == 0)
	{
		if (client_addr->sa_family == AF_INET6)
		{
			const struct sockaddr_in6* addr_in = (const struct sockaddr_in6*) client_addr;
			outPort = ntohs(addr_in->sin6_port);
		}
		else
		{
			const struct sockaddr_in* addr_in = (const struct sockaddr_in*) client_addr;
			outPort = ntohs(addr_in->sin_port);
		}
	}
	fc_free(client_addr);

	return outPort;
}